

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

size_t release_unused_segments(mstate m)

{
  malloc_segment *pmVar1;
  char *pcVar2;
  size_t __len;
  malloc_tree_chunk *pmVar3;
  tbinptr pmVar4;
  tbinptr pmVar5;
  byte bVar6;
  long lVar7;
  malloc_tree_chunk **ppmVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  malloc_tree_chunk *pmVar13;
  long lVar14;
  tbinptr pmVar15;
  ulong uVar16;
  tbinptr pmVar17;
  malloc_tree_chunk **ppmVar18;
  malloc_segment *pmVar19;
  uint uVar20;
  malloc_segment *pmVar21;
  malloc_segment *pmVar22;
  size_t local_58;
  
  pmVar19 = (m->seg).next;
  if (pmVar19 == (malloc_segment *)0x0) {
    uVar20 = 0;
    local_58 = 0;
  }
  else {
    uVar20 = 0;
    local_58 = 0;
    pmVar21 = &m->seg;
    do {
      pmVar1 = pmVar19->next;
      pmVar22 = pmVar19;
      if ((pmVar19->sflags & 9) == 1) {
        pcVar2 = pmVar19->base;
        uVar16 = (ulong)(-(int)pcVar2 - 0x10U & 0xf);
        uVar11 = *(ulong *)(pcVar2 + uVar16 + 8);
        if (((uint)uVar11 & 3) == 1) {
          __len = pmVar19->size;
          pmVar17 = (tbinptr)(pcVar2 + uVar16);
          uVar16 = uVar11 & 0xfffffffffffffff8;
          if (pcVar2 + (__len - 0x50) <= (char *)((long)pmVar17->child + (uVar16 - 0x20))) {
            if (pmVar17 == (tbinptr)m->dv) {
              m->dv = (mchunkptr)0x0;
              m->dvsize = 0;
            }
            else {
              pmVar15 = pmVar17->bk;
              pmVar3 = pmVar17->child[2];
              if (pmVar15 == pmVar17) {
                if (pmVar17->child[1] == (tbinptr)0x0) {
                  if (pmVar17->child[0] == (tbinptr)0x0) {
                    pmVar15 = (tbinptr)0x0;
                    goto LAB_001552d3;
                  }
                  pmVar4 = pmVar17->child[0];
                  ppmVar8 = pmVar17->child;
                }
                else {
                  pmVar4 = pmVar17->child[1];
                  ppmVar8 = pmVar17->child + 1;
                }
                do {
                  do {
                    ppmVar18 = ppmVar8;
                    pmVar15 = pmVar4;
                    pmVar4 = pmVar15->child[1];
                    ppmVar8 = pmVar15->child + 1;
                  } while (pmVar15->child[1] != (malloc_tree_chunk *)0x0);
                  pmVar4 = pmVar15->child[0];
                  ppmVar8 = pmVar15->child;
                } while (pmVar15->child[0] != (malloc_tree_chunk *)0x0);
                if (ppmVar18 < m->least_addr) goto LAB_001554f5;
                *ppmVar18 = (malloc_tree_chunk *)0x0;
              }
              else {
                pmVar13 = pmVar17->fd;
                if (((pmVar13 < (malloc_tree_chunk *)m->least_addr) || (pmVar13->bk != pmVar17)) ||
                   (pmVar15->fd != pmVar17)) goto LAB_001554f5;
                pmVar13->bk = pmVar15;
                pmVar15->fd = pmVar13;
              }
LAB_001552d3:
              if (pmVar3 != (malloc_tree_chunk *)0x0) {
                uVar12 = *(uint *)(pmVar17->child + 3);
                if (pmVar17 == m->treebins[uVar12]) {
                  m->treebins[uVar12] = pmVar15;
                  if (pmVar15 == (tbinptr)0x0) {
                    bVar6 = (byte)uVar12 & 0x1f;
                    m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
                  }
                  else {
LAB_0015530d:
                    pmVar4 = (tbinptr)m->least_addr;
                    if (pmVar15 < pmVar4) goto LAB_001554f5;
                    pmVar15->child[2] = pmVar3;
                    pmVar5 = pmVar17->child[0];
                    if (pmVar5 != (tbinptr)0x0) {
                      if (pmVar5 < pmVar4) goto LAB_001554f5;
                      pmVar15->child[0] = pmVar5;
                      pmVar5->child[2] = pmVar15;
                    }
                    pmVar3 = pmVar17->child[1];
                    if (pmVar3 != (malloc_tree_chunk *)0x0) {
                      if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001554f5;
                      pmVar15->child[1] = pmVar3;
                      pmVar3->parent = pmVar15;
                    }
                  }
                }
                else {
                  if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001554f5;
                  pmVar3->child[pmVar3->child[0] != pmVar17] = pmVar15;
                  if (pmVar15 != (tbinptr)0x0) goto LAB_0015530d;
                }
              }
            }
            iVar9 = munmap(pcVar2,__len);
            if (iVar9 == 0) {
              local_58 = local_58 + __len;
              m->footprint = m->footprint - __len;
              pmVar21->next = pmVar1;
              pmVar22 = pmVar21;
            }
            else {
              uVar12 = (uint)(uVar11 >> 8);
              if (uVar12 == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = 0x1f;
                if (uVar12 < 0x10000) {
                  uVar10 = ((uint)(uVar16 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar12)) & 0x3f)) &
                           1) + LZCOUNT(uVar12) * 2 ^ 0x3e;
                }
              }
              *(uint *)(pmVar17->child + 3) = uVar10;
              pmVar3 = (malloc_tree_chunk *)(m->treebins + uVar10);
              pmVar17->child[0] = (malloc_tree_chunk *)0x0;
              pmVar17->child[1] = (malloc_tree_chunk *)0x0;
              if ((m->treemap >> (uVar10 & 0x1f) & 1) == 0) {
                m->treemap = m->treemap | 1 << (uVar10 & 0x1f);
                pmVar3->prev_foot = (size_t)pmVar17;
                pmVar17->child[2] = pmVar3;
              }
              else {
                uVar11 = (ulong)(byte)(0x39 - (char)(uVar10 >> 1));
                if (uVar10 == 0x1f) {
                  uVar11 = 0;
                }
                lVar14 = uVar16 << (uVar11 & 0x3f);
                pmVar3 = (malloc_tree_chunk *)pmVar3->prev_foot;
                do {
                  pmVar13 = pmVar3;
                  if ((pmVar13->head & 0xfffffffffffffff8) == uVar16) {
                    if ((pmVar13 < (malloc_tree_chunk *)m->least_addr) ||
                       (pmVar3 = pmVar13->fd, pmVar3 < (malloc_tree_chunk *)m->least_addr))
                    goto LAB_001554f5;
                    pmVar3->bk = pmVar17;
                    pmVar13->fd = pmVar17;
                    pmVar17->fd = pmVar3;
                    pmVar17->bk = pmVar13;
                    pmVar17->child[2] = (malloc_tree_chunk *)0x0;
                    goto LAB_001554ae;
                  }
                  lVar7 = lVar14 >> 0x3f;
                  lVar14 = lVar14 * 2;
                  pmVar3 = *(malloc_tree_chunk **)((long)pmVar13 + lVar7 * -8 + 0x20);
                } while (pmVar3 != (malloc_tree_chunk *)0x0);
                pcVar2 = (char *)((long)pmVar13 + lVar7 * -8 + 0x20);
                if (pcVar2 < m->least_addr) {
LAB_001554f5:
                  abort();
                }
                *(tbinptr *)pcVar2 = pmVar17;
                pmVar17->child[2] = pmVar13;
              }
              pmVar17->bk = pmVar17;
              pmVar17->fd = pmVar17;
            }
          }
        }
      }
LAB_001554ae:
      uVar20 = uVar20 + 1;
      pmVar19 = pmVar1;
      pmVar21 = pmVar22;
    } while (pmVar1 != (malloc_segment *)0x0);
  }
  uVar11 = 0xfff;
  if (0xfff < uVar20) {
    uVar11 = (ulong)uVar20;
  }
  m->release_checks = uVar11;
  return local_58;
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}